

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  float fVar1;
  uint uVar2;
  undefined8 in_RAX;
  double *field;
  ulong uVar3;
  FieldMetadata *field_metadata;
  uint32 *has_bits_array;
  undefined8 uStack_38;
  
  if (0 < num_fields) {
    uVar3 = (ulong)(uint)num_fields;
    uStack_38 = in_RAX;
    do {
      uVar2 = field_metadata_table->type;
      if (0x69 < uVar2) {
switchD_0026d07e_caseD_12:
        SerializeNotImplemented(uVar2);
        goto LAB_0026d918;
      }
      field = (double *)(base + field_metadata_table->offset);
      switch(uVar2) {
      case 0:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d8e2:
          SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d7ef:
          SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d4aa:
          uVar2 = field_metadata_table->tag;
LAB_0026d4ae:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<3>::Serialize(field,output);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d54f:
          uVar2 = field_metadata_table->tag;
LAB_0026d553:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<4>::Serialize(field,output);
        }
        break;
      case 4:
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x0026d0db;
      case 5:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d66c:
          SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 6:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x0026d414;
      case 7:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d435:
          SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d141:
          uVar2 = field_metadata_table->tag;
LAB_0026d145:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          field = (double *)*field;
LAB_0026d6a1:
          PrimitiveTypeHelper<9>::Serialize(field,output);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d481:
          SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d525:
          SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x0026d53d;
      case 0xe:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x0026d3f4;
      case 0xf:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d903:
          SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x0026d82d;
      case 0x11:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d72b:
          uVar2 = field_metadata_table->tag;
LAB_0026d72f:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<18>::Serialize(field,output);
        }
        break;
      default:
        goto switchD_0026d07e_caseD_12;
      case 0x14:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0026d68b:
          uVar2 = field_metadata_table->tag;
LAB_0026d68f:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          goto LAB_0026d6a1;
        }
        break;
      case 0x15:
        if ((*field != 0.0) || (NAN(*field))) goto LAB_0026d8e2;
        break;
      case 0x16:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_0026d7ef;
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_0026d4aa;
        break;
      case 0x18:
        if (*field != 0.0) goto LAB_0026d54f;
        break;
      case 0x19:
      case 0x22:
        fVar1 = *(float *)field;
joined_r0x0026d0db:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_0026d0fc:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<5>::Serialize(field,output);
        }
        break;
      case 0x1a:
        if (*field != 0.0) goto LAB_0026d66c;
        break;
      case 0x1b:
        fVar1 = *(float *)field;
joined_r0x0026d414:
        if (fVar1 != 0.0) {
LAB_0026d64e:
          SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x1c:
        if (*(char *)field != '\0') goto LAB_0026d435;
        break;
      case 0x1d:
      case 0x20:
        if (*(long *)((long)*field + 8) != 0) goto LAB_0026d141;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_0026d481;
        break;
      case 0x1f:
        if (*field != 0.0) goto LAB_0026d525;
        break;
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x0026d53d:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_0026d58c:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<13>::Serialize(field,output);
        }
        break;
      case 0x23:
        fVar1 = *(float *)field;
joined_r0x0026d3f4:
        if (fVar1 != 0.0) {
LAB_0026d6d7:
          SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x24:
        if (*field != 0.0) goto LAB_0026d903;
        break;
      case 0x25:
        fVar1 = *(float *)field;
joined_r0x0026d82d:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_0026d837:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<17>::Serialize(field,output);
        }
        break;
      case 0x26:
        if (*field != 0.0) goto LAB_0026d72b;
        break;
      case 0x29:
        if (field[1] != 0.0) goto LAB_0026d68b;
        break;
      case 0x2a:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2b:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2c:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2d:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2e:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2f:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x30:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x31:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x32:
      case 0x35:
      case 0x3e:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x33:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x34:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x36:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x37:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x38:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x39:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3a:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3b:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3f:
        PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x40:
        PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x41:
        PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x42:
        PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x43:
        PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x44:
        PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x45:
        PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x46:
        PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x53:
        PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4b:
        PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4c:
        PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4d:
        PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4e:
        PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4f:
        PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x50:
        PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x54:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d8e2;
        break;
      case 0x55:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d7ef;
        break;
      case 0x56:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_0026d4ae;
        break;
      case 0x57:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_0026d553;
        break;
      case 0x58:
      case 0x61:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_0026d0fc;
      case 0x59:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d66c;
        break;
      case 0x5a:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_0026d64e;
      case 0x5b:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d435;
        break;
      case 0x5c:
      case 0x5f:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_0026d145;
        break;
      case 0x5d:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d481;
        break;
      case 0x5e:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
          uStack_38 = CONCAT44(field_metadata_table->tag,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          SerializeMessageTo<google::protobuf::io::CodedOutputStream>
                    ((MessageLite *)*field,field_metadata_table->ptr,output);
        }
        break;
      case 0x60:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_0026d58c;
      case 0x62:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_0026d6d7;
      case 99:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_0026d903;
        break;
      case 100:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_0026d837;
      case 0x65:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_0026d72f;
        break;
      case 0x68:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) {
          field = (double *)*field;
          goto LAB_0026d68f;
        }
        break;
      case 0x69:
        (*(code *)field_metadata_table->ptr)
                  (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                   field_metadata_table->has_offset,output);
      }
LAB_0026d918:
      field_metadata_table = field_metadata_table + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}